

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O1

Vector * CGNIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                double OmegaPrecond)

{
  bool bVar1;
  Boolean BVar2;
  LASErrIdType LVar3;
  size_t Dim;
  Vector *pVVar4;
  QMatrix *pQVar5;
  Vector *V1;
  int iVar6;
  double bNorm;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  Vector r;
  Vector p;
  Vector z;
  Vector s;
  Vector q;
  Vector local_120;
  Vector local_f0;
  Vector local_c0;
  Vector local_90;
  Vector local_60;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&local_120,"r",Dim,Normal,True);
  V_Constr(&local_f0,"p",Dim,Normal,True);
  V_Constr(&local_60,"q",Dim,Normal,True);
  V_Constr(&local_c0,"z",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar2 = Q_KerDefined(A), BVar2 != False)) {
    V_Constr(&local_90,"s",Dim,Normal,True);
  }
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar7 = l1Norm_V(x);
    auVar9._8_4_ = (int)(Dim >> 0x20);
    auVar9._0_8_ = Dim;
    auVar9._12_4_ = 0x45300000;
    pVVar4 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar7 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar4 = Mul_QV(A,x);
      pVVar4 = Sub_VV(b,pVVar4);
    }
    Asgn_VV(&local_120,pVVar4);
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar2 = Q_KerDefined(A), BVar2 == False)) {
      dVar7 = l2Norm_V(&local_120);
      BVar2 = RTCResult(0,dVar7,bNorm,CGNIterId);
      if (0 < MaxIter && BVar2 == False) {
        dVar7 = 0.0;
        iVar6 = 1;
        do {
          V1 = &local_c0;
          pQVar5 = Transp_Q(A);
          pVVar4 = Mul_QV(pQVar5,&local_120);
          Asgn_VV(V1,pVVar4);
          dVar8 = l2Norm_V(V1);
          dVar8 = dVar8 * dVar8;
          if (iVar6 != 1) {
            pVVar4 = Mul_SV(dVar8 / dVar7,&local_f0);
            V1 = Add_VV(V1,pVVar4);
          }
          Asgn_VV(&local_f0,V1);
          pVVar4 = Mul_QV(A,&local_f0);
          Asgn_VV(&local_60,pVVar4);
          dVar7 = l2Norm_V(&local_60);
          dVar7 = dVar8 / (dVar7 * dVar7);
          pVVar4 = Mul_SV(dVar7,&local_f0);
          AddAsgn_VV(x,pVVar4);
          pVVar4 = Mul_SV(dVar7,&local_60);
          SubAsgn_VV(&local_120,pVVar4);
          dVar7 = l2Norm_V(&local_120);
          BVar2 = RTCResult(iVar6,dVar7,bNorm,CGNIterId);
        } while ((BVar2 == False) &&
                (bVar1 = iVar6 < MaxIter, dVar7 = dVar8, iVar6 = iVar6 + 1, bVar1));
      }
    }
    else {
      dVar7 = l2Norm_V(&local_120);
      BVar2 = RTCResult(0,dVar7,bNorm,CGNIterId);
      if (0 < MaxIter && BVar2 == False) {
        dVar7 = 0.0;
        iVar6 = 1;
        do {
          if (PrecondProc == (PrecondProcType)0x0) {
            pVVar4 = &local_120;
          }
          else {
            (*PrecondProc)(A,&local_c0,&local_120,OmegaPrecond);
            pQVar5 = Transp_Q(A);
            (*PrecondProc)(pQVar5,&local_60,&local_c0,OmegaPrecond);
            pQVar5 = Transp_Q(A);
            pVVar4 = Mul_QV(pQVar5,&local_60);
          }
          Asgn_VV(&local_c0,pVVar4);
          BVar2 = Q_KerDefined(A);
          if (BVar2 != False) {
            OrthoRightKer_VQ(&local_c0,A);
          }
          dVar8 = l2Norm_V(&local_c0);
          dVar8 = dVar8 * dVar8;
          pVVar4 = &local_c0;
          if (iVar6 != 1) {
            pVVar4 = Mul_SV(dVar8 / dVar7,&local_f0);
            pVVar4 = Add_VV(&local_c0,pVVar4);
          }
          Asgn_VV(&local_f0,pVVar4);
          pVVar4 = Mul_QV(A,&local_f0);
          Asgn_VV(&local_60,pVVar4);
          if (PrecondProc == (PrecondProcType)0x0) {
            Asgn_VV(&local_90,&local_60);
          }
          else {
            (*PrecondProc)(A,&local_90,&local_60,OmegaPrecond);
          }
          BVar2 = Q_KerDefined(A);
          if (BVar2 != False) {
            OrthoRightKer_VQ(&local_90,A);
          }
          dVar7 = l2Norm_V(&local_90);
          dVar7 = dVar8 / (dVar7 * dVar7);
          pVVar4 = Mul_SV(dVar7,&local_f0);
          AddAsgn_VV(x,pVVar4);
          pVVar4 = Mul_SV(dVar7,&local_60);
          SubAsgn_VV(&local_120,pVVar4);
          dVar7 = l2Norm_V(&local_120);
          BVar2 = RTCResult(iVar6,dVar7,bNorm,CGNIterId);
        } while ((BVar2 == False) &&
                (bVar1 = iVar6 < MaxIter, dVar7 = dVar8, iVar6 = iVar6 + 1, bVar1));
      }
    }
    BVar2 = Q_KerDefined(A);
    if (BVar2 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr(&local_120);
  V_Destr(&local_f0);
  V_Destr(&local_60);
  V_Destr(&local_c0);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar2 = Q_KerDefined(A), BVar2 != False)) {
    V_Destr(&local_90);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGNIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, p, q, s, z;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    V_Constr(&z, "z", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&s, "s", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);
        
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CGN */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGNIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL) {
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
                    (*PrecondProc)(Transp_Q(A), &q, &z, OmegaPrecond);
                    Asgn_VV(&z, Mul_QV(Transp_Q(A), &q));
	        } else {
		    Asgn_VV(&z, &r);
		}
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
                Rho = pow(l2Norm_V(&z), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &s, &q, OmegaPrecond);
		else
		    Asgn_VV(&s, &q);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&s, A);
                Alpha = Rho / pow(l2Norm_V(&s), 2.0);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        } else {
            /* plain CGN */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGNIterId)
                && Iter < MaxIter) {
                Iter++;
                Asgn_VV(&z, Mul_QV(Transp_Q(A), &r));
                Rho = pow(l2Norm_V(&z), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / pow(l2Norm_V(&q), 2.0);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
    
    V_Destr(&r);
    V_Destr(&p);
    V_Destr(&q);
    V_Destr(&z);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&s);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}